

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_psa
          (psa_algorithm_t alg,psa_key_type_t key_type,size_t key_bits,
          mbedtls_cipher_id_t *cipher_id)

{
  mbedtls_cipher_mode_t mode;
  mbedtls_cipher_info_t *pmVar1;
  mbedtls_cipher_id_t cipher_id_00;
  uint uVar2;
  
  uVar2 = alg & 0x86ffc0ff;
  if ((alg & 0x7f000000) != 0x6000000) {
    uVar2 = alg;
  }
  if ((uVar2 & 0x7f000000 | 0x2000000) == 0x6000000) {
    if ((int)uVar2 < 0x4c00002) {
      if ((int)uVar2 < 0x4800001) {
        if ((uVar2 != 0x4600100) && (uVar2 != 0x4600101)) {
          return (mbedtls_cipher_info_t *)0x0;
        }
        mode = MBEDTLS_MODE_CBC;
      }
      else {
        mode = MBEDTLS_MODE_STREAM;
        if ((uVar2 != 0x4800001) && (uVar2 != 0x4800005)) {
          if (uVar2 != 0x4c00001) {
            return (mbedtls_cipher_info_t *)0x0;
          }
          mode = MBEDTLS_MODE_CTR;
        }
      }
    }
    else if ((int)uVar2 < 0x6000005) {
      if (uVar2 == 0x4c00002) {
        mode = MBEDTLS_MODE_CFB;
      }
      else {
        if (uVar2 != 0x4c00003) {
          return (mbedtls_cipher_info_t *)0x0;
        }
        mode = MBEDTLS_MODE_OFB;
      }
    }
    else if (uVar2 == 0x6000005) {
      mode = MBEDTLS_MODE_CHACHAPOLY;
    }
    else if (uVar2 == 0x6400001) {
      mode = MBEDTLS_MODE_CCM;
    }
    else {
      if (uVar2 != 0x6400002) {
        return (mbedtls_cipher_info_t *)0x0;
      }
      mode = MBEDTLS_MODE_GCM;
    }
  }
  else {
    mode = MBEDTLS_MODE_ECB;
    if (uVar2 != 0x2c00002) {
      return (mbedtls_cipher_info_t *)0x0;
    }
  }
  if (key_type < 0x2301) {
    if (key_type == 0x2002) {
      cipher_id_00 = MBEDTLS_CIPHER_ID_ARC4;
    }
    else {
      if (key_type != 0x2004) {
        return (mbedtls_cipher_info_t *)0x0;
      }
      cipher_id_00 = MBEDTLS_CIPHER_ID_CHACHA20;
    }
  }
  else if (key_type == 0x2403) {
    cipher_id_00 = MBEDTLS_CIPHER_ID_CAMELLIA;
  }
  else {
    cipher_id_00 = MBEDTLS_CIPHER_ID_AES;
    if (key_type != 0x2400) {
      if (key_type != 0x2301) {
        return (mbedtls_cipher_info_t *)0x0;
      }
      cipher_id_00 = (key_bits != 0x40) + MBEDTLS_CIPHER_ID_DES;
      if (key_bits == 0x80) {
        key_bits = 0xc0;
      }
    }
  }
  if (cipher_id != (mbedtls_cipher_id_t *)0x0) {
    *cipher_id = cipher_id_00;
  }
  pmVar1 = mbedtls_cipher_info_from_values(cipher_id_00,(int)key_bits,mode);
  return pmVar1;
}

Assistant:

static const mbedtls_cipher_info_t *mbedtls_cipher_info_from_psa(
    psa_algorithm_t alg,
    psa_key_type_t key_type,
    size_t key_bits,
    mbedtls_cipher_id_t* cipher_id )
{
    mbedtls_cipher_mode_t mode;
    mbedtls_cipher_id_t cipher_id_tmp;

    if( PSA_ALG_IS_AEAD( alg ) )
        alg = PSA_ALG_AEAD_WITH_TAG_LENGTH( alg, 0 );

    if( PSA_ALG_IS_CIPHER( alg ) || PSA_ALG_IS_AEAD( alg ) )
    {
        switch( alg )
        {
            case PSA_ALG_ARC4:
            case PSA_ALG_CHACHA20:
                mode = MBEDTLS_MODE_STREAM;
                break;
            case PSA_ALG_CTR:
                mode = MBEDTLS_MODE_CTR;
                break;
            case PSA_ALG_CFB:
                mode = MBEDTLS_MODE_CFB;
                break;
            case PSA_ALG_OFB:
                mode = MBEDTLS_MODE_OFB;
                break;
            case PSA_ALG_CBC_NO_PADDING:
                mode = MBEDTLS_MODE_CBC;
                break;
            case PSA_ALG_CBC_PKCS7:
                mode = MBEDTLS_MODE_CBC;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CCM, 0 ):
                mode = MBEDTLS_MODE_CCM;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_GCM, 0 ):
                mode = MBEDTLS_MODE_GCM;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CHACHA20_POLY1305, 0 ):
                mode = MBEDTLS_MODE_CHACHAPOLY;
                break;
            default:
                return( NULL );
        }
    }
    else if( alg == PSA_ALG_CMAC )
        mode = MBEDTLS_MODE_ECB;
    else
        return( NULL );

    switch( key_type )
    {
        case PSA_KEY_TYPE_AES:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_AES;
            break;
        case PSA_KEY_TYPE_DES:
            /* key_bits is 64 for Single-DES, 128 for two-key Triple-DES,
             * and 192 for three-key Triple-DES. */
            if( key_bits == 64 )
                cipher_id_tmp = MBEDTLS_CIPHER_ID_DES;
            else
                cipher_id_tmp = MBEDTLS_CIPHER_ID_3DES;
            /* mbedtls doesn't recognize two-key Triple-DES as an algorithm,
             * but two-key Triple-DES is functionally three-key Triple-DES
             * with K1=K3, so that's how we present it to mbedtls. */
            if( key_bits == 128 )
                key_bits = 192;
            break;
        case PSA_KEY_TYPE_CAMELLIA:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_CAMELLIA;
            break;
        case PSA_KEY_TYPE_ARC4:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_ARC4;
            break;
        case PSA_KEY_TYPE_CHACHA20:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_CHACHA20;
            break;
        default:
            return( NULL );
    }
    if( cipher_id != NULL )
        *cipher_id = cipher_id_tmp;

    return( mbedtls_cipher_info_from_values( cipher_id_tmp,
                                             (int) key_bits, mode ) );
}